

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloexec.c
# Opt level: O1

int cloexec_pipe(int *fds)

{
  int iVar1;
  
  iVar1 = pipe2(fds,0x80000);
  return iVar1;
}

Assistant:

int cloexec_pipe(int fds[2])
{
#ifdef __linux__
    return pipe2(fds, O_CLOEXEC);
#else
    int ret = -1;
    pthread_mutex_lock(&cloexec_mutex);

    if (pipe(fds) != 0)
        goto Exit;
    if (set_cloexec(fds[0]) != 0 || set_cloexec(fds[1]) != 0)
        goto Exit;
    ret = 0;

Exit:
    pthread_mutex_unlock(&cloexec_mutex);
    return ret;
#endif
}